

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

_Bool Curl_compareheader(char *headerline,char *header,char *content)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char *max;
  byte bVar5;
  char *__s;
  bool bVar6;
  bool bVar7;
  
  sVar2 = strlen(header);
  iVar1 = Curl_strncasecompare(headerline,header,sVar2);
  if (iVar1 != 0) {
    __s = headerline + sVar2;
    bVar5 = headerline[sVar2];
    if (bVar5 != 0) {
      ppuVar3 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar3 + (ulong)bVar5 * 2 + 1) & 0x20) == 0) break;
        bVar5 = __s[1];
        __s = __s + 1;
      } while (bVar5 != 0);
    }
    pcVar4 = strchr(__s,0xd);
    if ((pcVar4 == (char *)0x0) && (pcVar4 = strchr(__s,10), pcVar4 == (char *)0x0)) {
      sVar2 = strlen(__s);
      pcVar4 = __s + sVar2;
    }
    max = (char *)strlen(content);
    if (max <= pcVar4 + -(long)__s) {
      pcVar4 = pcVar4 + ~(ulong)__s;
      do {
        iVar1 = Curl_strncasecompare(__s,content,(size_t)max);
        bVar7 = iVar1 != 0;
        if (bVar7) {
          return bVar7;
        }
        __s = __s + 1;
        bVar6 = max <= pcVar4;
        pcVar4 = pcVar4 + -1;
      } while (bVar6);
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool
Curl_compareheader(const char *headerline, /* line to check */
                   const char *header,  /* header keyword _with_ colon */
                   const char *content) /* content string to find */
{
  /* RFC2616, section 4.2 says: "Each header field consists of a name followed
   * by a colon (":") and the field value. Field names are case-insensitive.
   * The field value MAY be preceded by any amount of LWS, though a single SP
   * is preferred." */

  size_t hlen = strlen(header);
  size_t clen;
  size_t len;
  const char *start;
  const char *end;

  if(!strncasecompare(headerline, header, hlen))
    return FALSE; /* doesn't start with header */

  /* pass the header */
  start = &headerline[hlen];

  /* pass all white spaces */
  while(*start && ISSPACE(*start))
    start++;

  /* find the end of the header line */
  end = strchr(start, '\r'); /* lines end with CRLF */
  if(!end) {
    /* in case there's a non-standard compliant line here */
    end = strchr(start, '\n');

    if(!end)
      /* hm, there's no line ending here, use the zero byte! */
      end = strchr(start, '\0');
  }

  len = end-start; /* length of the content part of the input line */
  clen = strlen(content); /* length of the word to find */

  /* find the content string in the rest of the line */
  for(;len>=clen;len--, start++) {
    if(strncasecompare(start, content, clen))
      return TRUE; /* match! */
  }

  return FALSE; /* no match */
}